

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O0

parser_error parse_projection_type(parser *p)

{
  char *pcVar1;
  void *pvVar2;
  projection *projection;
  char *type;
  parser *p_local;
  
  pcVar1 = parser_getstr(p,"type");
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    string_free(*(char **)((long)pvVar2 + 0x10));
    pcVar1 = string_make(pcVar1);
    *(char **)((long)pvVar2 + 0x10) = pcVar1;
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_projection_type(struct parser *p) {
	const char *type = parser_getstr(p, "type");
	struct projection *projection = parser_priv(p);

	if (!projection) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	string_free(projection->type);
	projection->type = string_make(type);
	return PARSE_ERROR_NONE;
}